

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::TextureCubeArray::updateView(TextureCubeArray *this,DepthStencilMode mode)

{
  bool bVar1;
  int iVar2;
  int y;
  ConstPixelBufferAccess *pCVar3;
  Sampler *pSVar4;
  int local_54;
  TextureCubeArrayView local_48;
  TextureCubeArrayView local_38;
  int local_28;
  undefined1 local_21;
  int numLevels;
  int iStack_1c;
  bool isMipmap;
  int height;
  int width;
  int baseLevel;
  DepthStencilMode mode_local;
  TextureCubeArray *this_local;
  
  width = mode;
  _baseLevel = this;
  height = rc::Texture::getBaseLevel(&this->super_Texture);
  bVar1 = hasLevel(this,height);
  if (bVar1) {
    pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
    bVar1 = isEmpty(pCVar3);
    if (!bVar1) {
      pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
      iStack_1c = tcu::ConstPixelBufferAccess::getWidth(pCVar3);
      pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
      numLevels = tcu::ConstPixelBufferAccess::getHeight(pCVar3);
      pSVar4 = rc::Texture::getSampler(&this->super_Texture);
      local_21 = isMipmapFilter(pSVar4->minFilter);
      if ((bool)local_21) {
        iVar2 = rc::Texture::getMaxLevel(&this->super_Texture);
        iVar2 = iVar2 - height;
        y = getNumMipLevels2D(iStack_1c,numLevels);
        local_54 = de::min<int>(iVar2 + 1,y);
      }
      else {
        local_54 = 1;
      }
      local_28 = local_54;
      TextureLevelArray::updateSamplerMode(&this->m_levels,width);
      iVar2 = local_28;
      pCVar3 = TextureLevelArray::getEffectiveLevels(&this->m_levels);
      tcu::TextureCubeArrayView::TextureCubeArrayView(&local_38,iVar2,pCVar3 + height);
      (this->m_view).m_numLevels = local_38.m_numLevels;
      *(undefined4 *)&(this->m_view).field_0x4 = local_38._4_4_;
      (this->m_view).m_levels = local_38.m_levels;
      return;
    }
  }
  tcu::TextureCubeArrayView::TextureCubeArrayView(&local_48,0,(ConstPixelBufferAccess *)0x0);
  (this->m_view).m_numLevels = local_48.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_48._4_4_;
  (this->m_view).m_levels = local_48.m_levels;
  return;
}

Assistant:

void TextureCubeArray::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels2D(width, height)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::TextureCubeArrayView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::TextureCubeArrayView(0, DE_NULL);
}